

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O3

void __thiscall ADynamicLight::PostBeginPlay(ADynamicLight *this)

{
  subsector_t *psVar1;
  
  AActor::PostBeginPlay(&this->super_AActor);
  if (((this->super_AActor).SpawnFlags & 0x10) == 0) {
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0xd])(this,0);
  }
  psVar1 = R_PointInSubsector(SUB84((this->super_AActor).__Pos.X + 103079215104.0,0),
                              SUB84((this->super_AActor).__Pos.Y + 103079215104.0,0));
  this->subsector = psVar1;
  return;
}

Assistant:

void ADynamicLight::PostBeginPlay()
{
	Super::PostBeginPlay();
	
	if (!(SpawnFlags & MTF_DORMANT))
	{
		Activate (NULL);
	}

	subsector = R_PointInSubsector(Pos());
}